

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O1

Reg asm_load_lightud64(ASMState *as,IRIns *ir,int typecheck)

{
  MCode *pMVar1;
  Reg RVar2;
  Reg RVar3;
  byte bVar4;
  uint uVar5;
  long lVar6;
  
  if (((-1 < (char)(ir->field_1).r) || (typecheck != 0)) || (RVar2 = 0x80, (ir->field_1).s != '\0'))
  {
    RVar2 = ra_dest(as,ir,0xffef);
    if (typecheck != 0) {
      RVar3 = ra_scratch(as,~(1 << (RVar2 & 0x1f)) & 0xffef);
      asm_guardcc(as,5);
      pMVar1 = as->mcp;
      as->mcp = pMVar1 + -1;
      pMVar1[-1] = 0xfe;
      pMVar1 = as->mcp;
      bVar4 = (byte)RVar3;
      pMVar1[-1] = bVar4 | 0xf8;
      pMVar1[-2] = 0x83;
      lVar6 = -2;
      uVar5 = RVar3 >> 3 & 1;
      if (uVar5 != 0) {
        pMVar1[-3] = 'A';
        lVar6 = -3;
      }
      as->mcp = pMVar1 + lVar6 + -1;
      pMVar1[lVar6 + -1] = '/';
      pMVar1 = as->mcp;
      pMVar1[-1] = bVar4 | 0xf8;
      pMVar1[-2] = 0xc1;
      pMVar1[-3] = (byte)uVar5 | 0x48;
      as->mcp = pMVar1 + -3;
      pMVar1[-4] = ((byte)RVar2 & 7) + bVar4 * '\b' | 0xc0;
      pMVar1[-5] = 0x8b;
      pMVar1[-6] = (byte)(RVar2 >> 3) & 1 | (byte)(RVar3 >> 1) & 4 | 0x48;
      as->mcp = pMVar1 + -6;
    }
  }
  return RVar2;
}

Assistant:

static Reg asm_load_lightud64(ASMState *as, IRIns *ir, int typecheck)
{
  if (ra_used(ir) || typecheck) {
    Reg dest = ra_dest(as, ir, RSET_GPR);
    if (typecheck) {
      Reg tmp = ra_scratch(as, rset_exclude(RSET_GPR, dest));
      asm_guardcc(as, CC_NE);
      emit_i8(as, -2);
      emit_rr(as, XO_ARITHi8, XOg_CMP, tmp);
      emit_shifti(as, XOg_SAR|REX_64, tmp, 47);
      emit_rr(as, XO_MOV, tmp|REX_64, dest);
    }
    return dest;
  } else {
    return RID_NONE;
  }
}